

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O1

void __thiscall FIX::FieldMap::removeGroup(FieldMap *this,int num,int tag)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr *pp_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  IntField groupCount;
  FieldBase FStack_78;
  
  p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < tag]) {
    if (tag <= (int)p_Var2[1]._M_color) {
      p_Var4 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, tag < (int)p_Var4[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((0 < num) && ((_Rb_tree_header *)__position._M_node != p_Var1)) {
    if ((ulong)(uint)num <=
        (ulong)((long)__position._M_node[1]._M_left - (long)__position._M_node[1]._M_parent >> 3)) {
      p_Var2 = (_Base_ptr)(&(__position._M_node[1]._M_parent)->_M_color + (ulong)(uint)num * 2);
      p_Var4 = p_Var2[-1]._M_right;
      if (p_Var4 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var4 + 8))();
      }
      if (p_Var2 != __position._M_node[1]._M_left) {
        memmove(&p_Var2[-1]._M_right,p_Var2,(long)__position._M_node[1]._M_left - (long)p_Var2);
      }
      pp_Var3 = &__position._M_node[1]._M_left[-1]._M_right;
      __position._M_node[1]._M_left = (_Base_ptr)pp_Var3;
      if ((_Base_ptr)pp_Var3 == __position._M_node[1]._M_parent) {
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
                            *)&this->m_groups,__position);
        removeField(this,tag);
        return;
      }
      IntField::IntField((IntField *)&FStack_78,tag,
                         (int)((ulong)((long)__position._M_node[1]._M_left -
                                      (long)__position._M_node[1]._M_parent) >> 3));
      setField(this,&FStack_78,true);
      FieldBase::~FieldBase(&FStack_78);
    }
  }
  return;
}

Assistant:

void FieldMap::removeGroup(int num, int tag) {
  Groups::iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }
  if (num <= 0) {
    return;
  }
  std::vector<FieldMap *> &groups = tagWithGroups->second;
  if (groups.size() < static_cast<unsigned>(num)) {
    return;
  }

  std::vector<FieldMap *>::iterator group = groups.begin();
  std::advance(group, (num - 1));

  delete (*group);
  groups.erase(group);

  if (groups.size() == 0) {
    m_groups.erase(tagWithGroups);
    removeField(tag);
  } else {
    IntField groupCount(tag, (int)groups.size());
    setField(groupCount);
  }
}